

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DeltaBinaryPackedDecoder::Skip
          (DeltaBinaryPackedDecoder *this,uint8_t *defines,idx_t skip_count)

{
  type tVar1;
  idx_t skip_count_00;
  pointer pDVar2;
  runtime_error *this_00;
  
  skip_count_00 = ColumnReader::GetValidCount(this->reader,defines,skip_count,0);
  tVar1 = this->reader->column_schema->parquet_type;
  if (tVar1 == INT64) {
    pDVar2 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::Skip<long>(pDVar2,skip_count_00);
    return;
  }
  if (tVar1 == INT32) {
    pDVar2 = unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::
             operator->(&this->dbp_decoder);
    DbpDecoder::Skip<int>(pDVar2,skip_count_00);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"DELTA_BINARY_PACKED should only be INT32 or INT64");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DeltaBinaryPackedDecoder::Skip(uint8_t *defines, idx_t skip_count) {
	idx_t valid_count = reader.GetValidCount(defines, skip_count);
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::INT32:
		dbp_decoder->Skip<int32_t>(valid_count);
		break;
	case duckdb_parquet::Type::INT64:
		dbp_decoder->Skip<int64_t>(valid_count);
		break;

	default:
		throw std::runtime_error("DELTA_BINARY_PACKED should only be INT32 or INT64");
	}
}